

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

int sha512_process(sha512_state *md,uchar *in,unsigned_long inlen)

{
  int iVar1;
  size_t local_40;
  int err;
  unsigned_long n;
  unsigned_long inlen_local;
  uchar *in_local;
  sha512_state *md_local;
  
  if (md == (sha512_state *)0x0) {
    md_local._4_4_ = -1;
  }
  else if (in == (uchar *)0x0) {
    md_local._4_4_ = -1;
  }
  else if (md->curlen < 0x81) {
    if ((md->length + inlen * 8 < md->length) ||
       (n = inlen, inlen_local = (unsigned_long)in, inlen << 3 < inlen)) {
      md_local._4_4_ = -1;
    }
    else {
      while (n != 0) {
        if ((md->curlen == 0) && (0x7f < n)) {
          iVar1 = s_sha512_compress(md,(uchar *)inlen_local);
          if (iVar1 != 0) {
            return iVar1;
          }
          md->length = md->length + 0x400;
          inlen_local = inlen_local + 0x80;
          n = n - 0x80;
        }
        else {
          if (n < 0x80 - md->curlen) {
            local_40 = n;
          }
          else {
            local_40 = 0x80 - md->curlen;
          }
          memcpy(md->buf + md->curlen,(void *)inlen_local,local_40);
          md->curlen = local_40 + md->curlen;
          inlen_local = local_40 + inlen_local;
          n = n - local_40;
          if (md->curlen == 0x80) {
            iVar1 = s_sha512_compress(md,md->buf);
            if (iVar1 != 0) {
              return iVar1;
            }
            md->length = md->length + 0x400;
            md->curlen = 0;
          }
        }
      }
      md_local._4_4_ = 0;
    }
  }
  else {
    md_local._4_4_ = -1;
  }
  return md_local._4_4_;
}

Assistant:

static int sha512_process(struct sha512_state * md, const unsigned char *in, unsigned long inlen)
{
    unsigned long n;
    int err;
    if (md == NULL) return -1;
    if (in == NULL) return -1;
    if (md->curlen > sizeof(md->buf)) {
        return -1;
    }
    if (((md->length + inlen * 8) < md->length)
        || ((inlen * 8) < inlen)) {
        return -1;
    }
    while (inlen > 0) {
        if (md->curlen == 0 && inlen >= 128) {
            if ((err = s_sha512_compress(md, in)) != 0) {
                return err;
            }
            md->length += 128 * 8;
            in         += 128;
            inlen      -= 128;
        } else {
            n = MIN(inlen, (128 - md->curlen));
            memcpy(md->buf + md->curlen, in, (size_t)n);
            md->curlen += n;
            in         += n;
            inlen      -= n;
            if (md->curlen == 128) {
                if ((err = s_sha512_compress(md, md->buf)) != 0) {
                    return err;
                }
                md->length += 8 * 128;
                md->curlen = 0;
            }
        }
    }
    return 0;
}